

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O3

void __thiscall calculator::Lexer::scan(Lexer *this)

{
  int *piVar1;
  pointer psVar2;
  size_type this_00;
  uint uVar3;
  int iVar4;
  iterator iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Float *__p;
  Token *pTVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__p_00;
  iterator iVar8;
  Number *__p_01;
  iterator iVar9;
  mapped_type *pmVar10;
  _Elt_pointer pbVar11;
  iterator iVar12;
  ZeroNumberException *this_01;
  SyntaxError *pSVar13;
  FunctionNotDefined *this_02;
  pointer pcVar14;
  HexBinOctException *pHVar15;
  char cVar16;
  char *pcVar17;
  byte *pbVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  _Alloc_hider _Var23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  byte bVar27;
  ulong unaff_R12;
  byte bVar28;
  bool bVar29;
  bool bVar30;
  string s;
  stringstream ss;
  string local_1f8;
  pointer local_1d8;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [7];
  ios_base local_150 [264];
  shared_ptr<calculator::Token> local_48;
  pointer local_38;
  
  iVar4 = (this->reader_).len_;
  uVar24 = (this->reader_).ptr_;
  uVar22 = (ulong)uVar24;
  if ((int)uVar24 < iVar4) {
    uVar25 = (ulong)(int)uVar24;
    pcVar17 = (this->reader_).sbuffer_;
    iVar26 = this->line_;
    (this->reader_).ptr_ = (int)(uVar25 + 1);
    if ((long)iVar4 - 1U == uVar25) {
      return;
    }
    lVar21 = 0;
    while( true ) {
      bVar28 = pcVar17[lVar21 + uVar25 + 1];
      unaff_R12 = (ulong)bVar28;
      iVar20 = (int)lVar21;
      if (0x2d < unaff_R12) break;
      if ((0x100000a01U >> (unaff_R12 & 0x3f) & 1) == 0) {
        if (unaff_R12 != 10) {
          if ((0x280000000000U >> (unaff_R12 & 0x3f) & 1) == 0) break;
          iVar26 = uVar24 + iVar20 + 2;
          (this->reader_).ptr_ = iVar26;
          uVar24 = uVar24 + iVar20 + 1;
          if (iVar4 <= iVar26) goto LAB_0010d462;
          uVar22 = lVar21 + uVar22 + 3;
          uVar3 = iVar4 - 1;
          pbVar18 = (byte *)(pcVar17 + (int)uVar24);
          goto LAB_0010c7f0;
        }
        iVar26 = iVar26 + 1;
        this->line_ = iVar26;
      }
      (this->reader_).ptr_ = uVar24 + iVar20 + 2;
      lVar21 = lVar21 + 1;
      if (~uVar25 + (long)iVar4 == lVar21) {
        return;
      }
    }
    if (bVar28 == 0xff) {
      return;
    }
    uVar24 = uVar24 + iVar20 + 1;
  }
  goto LAB_0010c5fc;
  while( true ) {
    (this->reader_).ptr_ = iVar26;
    uVar22 = (ulong)(iVar26 + 1);
    if (iVar26 == iVar4) break;
LAB_0010c7f0:
    pbVar18 = pbVar18 + 1;
    bVar27 = *pbVar18;
    iVar26 = (int)uVar22;
    if ((0x20 < (ulong)bVar27) || ((0x100000a01U >> ((ulong)bVar27 & 0x3f) & 1) == 0)) {
      uVar3 = iVar26 - 2;
      goto LAB_0010d459;
    }
  }
  bVar27 = 0xff;
LAB_0010d459:
  uVar24 = uVar3;
  if (bVar28 == bVar27) {
    pSVar13 = (SyntaxError *)__cxa_allocate_exception(0x28);
    local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"can not present continue symbol ++/--","");
    SyntaxError::SyntaxError(pSVar13,(string *)local_1d0);
    __cxa_throw(pSVar13,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
  }
LAB_0010d462:
  (this->reader_).ptr_ = uVar24;
LAB_0010c5fc:
  bVar28 = this->lookforward_;
  if ((((bVar28 == 0x29) || ((bVar28 & 0xdf) == 0x45)) ||
      ((bVar29 = (char)unaff_R12 == '-', !bVar29 && (((uint)unaff_R12 & 0xff) != 0x2b)))) ||
     (((byte)(bVar28 - 0x30) < 10 || (bVar28 == 0x2e || (byte)((bVar28 & 0xdf) + 0xbf) < 0x1a)))) {
    bVar29 = false;
  }
  else {
    uVar22 = (long)(int)uVar24 + 1;
    (this->reader_).ptr_ = (int)uVar22;
    unaff_R12 = 0xff;
    if ((int)uVar22 < iVar4) {
      unaff_R12 = (ulong)(byte)(this->reader_).sbuffer_[uVar22];
    }
    while ((uVar24 = (uint)uVar22, (byte)unaff_R12 < 0x21 &&
           ((0x100000a01U >> (unaff_R12 & 0x3f) & 1) != 0))) {
      uVar24 = uVar24 + 1;
      uVar22 = (ulong)uVar24;
      (this->reader_).ptr_ = uVar24;
      unaff_R12 = 0xff;
      if ((int)uVar24 < iVar4) {
        unaff_R12 = (ulong)(byte)(this->reader_).sbuffer_[(int)uVar24];
      }
    }
  }
  bVar28 = (byte)unaff_R12;
  this->lookforward_ = bVar28;
  uVar3 = (uint)unaff_R12 & 0xff;
  if (0x3b < uVar3) {
    if (uVar3 < 0x5e) {
      if (uVar3 == 0x3c) {
        iVar26 = (int)((long)(int)uVar24 + 1);
        (this->reader_).ptr_ = iVar26;
        if ((iVar4 <= iVar26) || ((this->reader_).sbuffer_[(long)(int)uVar24 + 1] != '<')) {
          (this->reader_).ptr_ = uVar24;
          pSVar13 = (SyntaxError *)__cxa_allocate_exception(0x28);
          local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"unexpected <?","");
          SyntaxError::SyntaxError(pSVar13,(string *)local_1d0);
          __cxa_throw(pSVar13,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
        pTVar7 = (Token *)operator_new(0x48);
        Token::Token(pTVar7,ShiftLeft);
        local_1d0._0_8_ = pTVar7;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar7);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf77;
      }
      if (uVar3 == 0x3d) {
        pTVar7 = (Token *)operator_new(0x48);
        Token::Token(pTVar7,Equal);
        local_1d0._0_8_ = pTVar7;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar7);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf77;
      }
      if (uVar3 == 0x3e) {
        iVar26 = (int)((long)(int)uVar24 + 1);
        (this->reader_).ptr_ = iVar26;
        if ((iVar4 <= iVar26) || ((this->reader_).sbuffer_[(long)(int)uVar24 + 1] != '>')) {
          (this->reader_).ptr_ = uVar24;
          pSVar13 = (SyntaxError *)__cxa_allocate_exception(0x28);
          local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"unexpected >?","");
          SyntaxError::SyntaxError(pSVar13,(string *)local_1d0);
          __cxa_throw(pSVar13,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
        pTVar7 = (Token *)operator_new(0x48);
        Token::Token(pTVar7,ShiftRight);
        local_1d0._0_8_ = pTVar7;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar7);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf77;
      }
    }
    else {
      if (uVar3 == 0x5e) {
        pTVar7 = (Token *)operator_new(0x48);
        Token::Token(pTVar7,Xor);
        local_1d0._0_8_ = pTVar7;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar7);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf77;
      }
      if (uVar3 == 0x7c) {
        pTVar7 = (Token *)operator_new(0x48);
        Token::Token(pTVar7,Or);
        local_1d0._0_8_ = pTVar7;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar7);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf77;
      }
      if (uVar3 == 0x7e) {
        pTVar7 = (Token *)operator_new(0x48);
        Token::Token(pTVar7,Negate);
        local_1d0._0_8_ = pTVar7;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &((key_type *)local_1d0)->_M_string_length,pTVar7);
        std::
        vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
        ::emplace_back<std::shared_ptr<calculator::Token>>
                  ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                    *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        goto LAB_0010cf77;
      }
    }
    goto switchD_0010c676_caseD_22;
  }
  switch(uVar3) {
  case 0x21:
    pTVar7 = (Token *)operator_new(0x48);
    Token::Token(pTVar7,Not);
    local_1d0._0_8_ = pTVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((key_type *)local_1d0)->_M_string_length,pTVar7);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    break;
  default:
    goto switchD_0010c676_caseD_22;
  case 0x25:
    pTVar7 = (Token *)operator_new(0x48);
    Token::Token(pTVar7,Mod);
    local_1d0._0_8_ = pTVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((key_type *)local_1d0)->_M_string_length,pTVar7);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    break;
  case 0x26:
    pTVar7 = (Token *)operator_new(0x48);
    Token::Token(pTVar7,And);
    local_1d0._0_8_ = pTVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((key_type *)local_1d0)->_M_string_length,pTVar7);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    break;
  case 0x2a:
    iVar26 = (int)((long)(int)uVar24 + 1);
    (this->reader_).ptr_ = iVar26;
    if ((iVar26 < iVar4) && ((this->reader_).sbuffer_[(long)(int)uVar24 + 1] == '*')) {
      pTVar7 = (Token *)operator_new(0x48);
      Token::Token(pTVar7,Pow);
      local_1d0._0_8_ = pTVar7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &((key_type *)local_1d0)->_M_string_length,pTVar7);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    }
    else {
      (this->reader_).ptr_ = uVar24;
      pTVar7 = (Token *)operator_new(0x48);
      Token::Token(pTVar7,Mul);
      local_1d0._0_8_ = pTVar7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &((key_type *)local_1d0)->_M_string_length,pTVar7);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    }
    break;
  case 0x2b:
    pTVar7 = (Token *)operator_new(0x48);
    Token::Token(pTVar7,Add);
    local_1d0._0_8_ = pTVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((key_type *)local_1d0)->_M_string_length,pTVar7);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    break;
  case 0x2d:
    if (bVar29 == false) {
      pTVar7 = (Token *)operator_new(0x48);
      Token::Token(pTVar7,Sub);
      local_1d0._0_8_ = pTVar7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &((key_type *)local_1d0)->_M_string_length,pTVar7);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
      break;
    }
switchD_0010c676_caseD_22:
    bVar30 = bVar28 == 0x2e;
    if (!bVar30 && 9 < (byte)(bVar28 - 0x30)) {
      if (0x19 < (byte)((bVar28 & 0xdf) + 0xbf)) {
        if (bVar28 == 0x28) {
          if (this->is_function_ == true) {
            local_1d0[0] = 1;
            std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                      (&(this->bracket_match_).c,(bool *)local_1d0);
            this->is_function_ = false;
            pTVar7 = (Token *)operator_new(0x48);
            Token::Token(pTVar7,BEGIN_FUNC);
            local_1d0._0_8_ = pTVar7;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &((key_type *)local_1d0)->_M_string_length,pTVar7);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
          }
          else {
            local_1d0._0_8_ = (ulong)(uint7)local_1d0._1_7_ << 8;
            std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                      (&(this->bracket_match_).c,(bool *)local_1d0);
            this->is_function_ = false;
            pTVar7 = (Token *)operator_new(0x48);
            Token::Token(pTVar7,BEGIN_BRACKET);
            local_1d0._0_8_ = pTVar7;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &((key_type *)local_1d0)->_M_string_length,pTVar7);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
          }
        }
        else if (uVar3 == 0x29) {
          pbVar11 = (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur;
          if (pbVar11 ==
              (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur) {
            pSVar13 = (SyntaxError *)__cxa_allocate_exception(0x28);
            local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1d0,"expression unexpected (!","");
            SyntaxError::SyntaxError(pSVar13,(string *)local_1d0);
            __cxa_throw(pSVar13,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
          }
          if (pbVar11 ==
              (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            pbVar11 = (this->bracket_match_).c.super__Deque_base<bool,_std::allocator<bool>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
          }
          bVar29 = pbVar11[-1];
          std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->bracket_match_).c);
          this->is_function_ = false;
          if (bVar29 == true) {
            pTVar7 = (Token *)operator_new(0x48);
            Token::Token(pTVar7,END_FUNC);
            local_1d0._0_8_ = pTVar7;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &((key_type *)local_1d0)->_M_string_length,pTVar7);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
          }
          else {
            pTVar7 = (Token *)operator_new(0x48);
            Token::Token(pTVar7,END_BRACKET);
            local_1d0._0_8_ = pTVar7;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &((key_type *)local_1d0)->_M_string_length,pTVar7);
            std::
            vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
            ::emplace_back<std::shared_ptr<calculator::Token>>
                      ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                        *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
          }
        }
        else if (uVar3 == 0x3b) {
          psVar2 = (this->tokenlist_).
                   super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (((this->tokenlist_).
               super__Vector_base<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
               ._M_impl.super__Vector_impl_data._M_start != psVar2) &&
             (iVar4 = (*(psVar2[-1].
                         super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        _vptr_Token[2])(), iVar4 == 0x13)) {
            return;
          }
          pTVar7 = (Token *)operator_new(0x48);
          Token::Token(pTVar7,END_SEP);
          local_1d0._0_8_ = pTVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &((key_type *)local_1d0)->_M_string_length,pTVar7);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        }
        else {
          pTVar7 = (Token *)operator_new(0x48);
          Token::Token(pTVar7,bVar28);
          local_1d0._0_8_ = pTVar7;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &((key_type *)local_1d0)->_M_string_length,pTVar7);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
        }
        break;
      }
      local_1d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1c0[0]._M_local_buf[0] = '\0';
      local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
      do {
        std::__cxx11::string::_M_replace_aux((ulong)local_1d0,local_1d0._8_8_,0,'\x01');
        iVar4 = (this->reader_).ptr_;
        iVar26 = (int)((long)iVar4 + 1);
        (this->reader_).ptr_ = iVar26;
        if ((this->reader_).len_ <= iVar26) goto LAB_0010d269;
        bVar28 = (this->reader_).sbuffer_[(long)iVar4 + 1];
      } while ((byte)((bVar28 & 0xdf) + 0xbf) < 0x1a);
      if ((byte)(bVar28 - 0x30) < 10) {
        do {
          std::__cxx11::string::_M_replace_aux((ulong)local_1d0,local_1d0._8_8_,0,'\x01');
          iVar4 = (this->reader_).ptr_;
          iVar26 = (int)((long)iVar4 + 1);
          (this->reader_).ptr_ = iVar26;
          if ((this->reader_).len_ <= iVar26) goto LAB_0010d269;
          bVar28 = (this->reader_).sbuffer_[(long)iVar4 + 1];
        } while ((byte)(bVar28 - 0x30) < 10);
      }
      if (bVar28 == 0x28) {
        iVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->unary_functions)._M_h,(key_type *)local_1d0);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double)>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          iVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->binary_functions)._M_h,(key_type *)local_1d0);
          if (iVar12.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            this_02 = (FunctionNotDefined *)__cxa_allocate_exception(0x28);
            FunctionNotDefined::FunctionNotDefined(this_02,(string *)local_1d0);
            __cxa_throw(this_02,&FunctionNotDefined::typeinfo,SyntaxError::~SyntaxError);
          }
          piVar1 = &(this->reader_).ptr_;
          *piVar1 = *piVar1 + -1;
          this->is_function_ = true;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(0x70);
          Word::Word((Word *)paVar6,(string *)local_1d0,bVar29,BinaryFunction);
          paVar6->_M_allocated_capacity = (size_type)&PTR__Word_00118b08;
          local_1f8._M_dataplus._M_p = (pointer)paVar6;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<calculator::BinaryFunction*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                     (BinaryFunction *)paVar6);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
        }
        else {
          piVar1 = &(this->reader_).ptr_;
          *piVar1 = *piVar1 + -1;
          this->is_function_ = true;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(0x70);
          Word::Word((Word *)paVar6,(string *)local_1d0,bVar29,Function);
          paVar6->_M_allocated_capacity = (size_type)&PTR__Word_00118ab0;
          local_1f8._M_dataplus._M_p = (pointer)paVar6;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Function*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                     (Function *)paVar6);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
        }
LAB_0010d4dc:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
        }
      }
      else {
LAB_0010d269:
        (this->reader_).ptr_ = iVar4;
        iVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->variable)._M_h,(key_type *)local_1d0);
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(0x70);
          Word::Word((Word *)paVar6,(string *)local_1d0,bVar29,Identifier);
          local_1f8._M_dataplus._M_p = (pointer)paVar6;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Word*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                     (Word *)paVar6);
          pmVar10 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->variable,(key_type *)local_1d0);
          (pmVar10->super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)local_1f8._M_dataplus._M_p;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pmVar10->super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length);
          std::
          vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
          ::push_back(&this->tokenlist_,(value_type *)&local_1f8);
          goto LAB_0010d4dc;
        }
        if (bVar29 != false) {
          __p_01 = (Number *)operator_new(0x50);
          Token::Token((Token *)__p_01,Number);
          (__p_01->super_Token)._vptr_Token = (_func_int **)&PTR__Token_00118a20;
          __p_01->__value = -1;
          local_1f8._M_dataplus._M_p = (pointer)__p_01;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Number*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                     __p_01);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
          }
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(0x48);
          Token::Token((Token *)paVar6,Mul);
          local_1f8._M_dataplus._M_p = (pointer)paVar6;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                     (Token *)paVar6);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
          }
        }
        iVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)this,(key_type *)
                               ((long)iVar8.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
                                      ._M_cur + 8));
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
            ._M_cur != (__node_type *)0x0) {
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(0x50);
          local_1d8 = *(pointer *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                              ._M_cur + 0x28);
          Token::Token((Token *)paVar6,Float);
          paVar6->_M_allocated_capacity = (size_type)&PTR__Token_00118a68;
          (((string *)(paVar6->_M_local_buf + 0x48))->_M_dataplus)._M_p = local_1d8;
          local_1f8._M_dataplus._M_p = (pointer)paVar6;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Float*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                     (Float *)paVar6);
          std::
          vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
          ::emplace_back<std::shared_ptr<calculator::Token>>
                    ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                      *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
          goto LAB_0010d4dc;
        }
        std::
        vector<std::shared_ptr<calculator::Token>,_std::allocator<std::shared_ptr<calculator::Token>_>_>
        ::push_back(&this->tokenlist_,
                    (value_type *)
                    ((long)iVar8.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<calculator::Token>_>,_true>
                           ._M_cur + 0x28));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ == &((key_type *)local_1d0)->field_2) {
        return;
      }
LAB_0010d659:
      lVar21 = CONCAT71(local_1c0[0]._M_allocated_capacity._1_7_,local_1c0[0]._M_local_buf[0]);
      _Var23._M_p = (pointer)local_1d0._0_8_;
      goto LAB_0010d65e;
    }
LAB_0010cb18:
    paVar6 = &local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    local_1f8._M_dataplus._M_p = (pointer)paVar6;
    if (bVar29 != false) {
      std::__cxx11::string::push_back((char)&local_1f8);
    }
    bVar28 = 0;
    bVar29 = false;
    if (bVar30) {
LAB_0010cb4d:
      std::__cxx11::string::_M_replace_aux((ulong)&local_1f8,local_1f8._M_string_length,0,'\x01');
      while( true ) {
        iVar4 = (this->reader_).ptr_;
        uVar22 = (long)iVar4 + 1;
        (this->reader_).ptr_ = (int)uVar22;
        iVar26 = (this->reader_).len_;
        if (iVar26 <= (int)uVar22) break;
        pcVar17 = (this->reader_).sbuffer_;
        bVar27 = pcVar17[uVar22];
        bVar30 = bVar29;
        if (((bVar27 & 0xdf) == 0x45) && (bVar30 = true, bVar29)) {
          pSVar13 = (SyntaxError *)__cxa_allocate_exception(0x28);
          local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"expoent e/E is to many!","");
          SyntaxError::SyntaxError(pSVar13,(string *)local_1d0);
          __cxa_throw(pSVar13,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
        bVar29 = bVar30;
        if ((((bVar27 == 0x2d) || (bVar27 == 0x2b)) &&
            (((bool)(bVar28 | iVar4 < 0) ||
             (bVar28 = 1, (pcVar17[(uVar22 & 0xffffffff) - 1] & 0xdfU) != 0x45)))) ||
           ((((byte)(bVar27 - 0x3a) < 0xf6 && (bVar27 & 0xdf) != 0x45 && (bVar27 != 0x2d)) &&
            (bVar27 != 0x2b)))) break;
        std::__cxx11::string::_M_replace_aux((ulong)&local_1f8,local_1f8._M_string_length,0,'\x01');
      }
      (this->reader_).ptr_ = iVar4;
      cVar16 = -1;
      if (iVar4 < iVar26 && -1 < iVar4) {
        cVar16 = (this->reader_).sbuffer_[iVar4];
      }
      this->lookforward_ = cVar16;
      __p = (Float *)operator_new(0x50);
      std::__cxx11::stringstream::stringstream((stringstream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((key_type *)local_1d0)->field_2,local_1f8._M_dataplus._M_p,
                 local_1f8._M_string_length);
      std::istream::_M_extract<double>((double *)local_1d0);
      local_1d8 = local_38;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1d0);
      std::ios_base::~ios_base(local_150);
      Token::Token((Token *)__p,Float);
      (__p->super_Token)._vptr_Token = (_func_int **)&PTR__Token_00118a68;
      __p->__value = (double)local_1d8;
      local_48.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)__p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Float*>
                (&local_48.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,__p);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,&local_48);
    }
    else {
      while( true ) {
        bVar27 = (byte)unaff_R12;
        bVar30 = bVar29;
        if (((bVar27 & 0xdf) == 0x45) && (bVar30 = true, bVar29)) {
          pSVar13 = (SyntaxError *)__cxa_allocate_exception(0x28);
          local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"expoent e/E is to many!","");
          SyntaxError::SyntaxError(pSVar13,(string *)local_1d0);
          __cxa_throw(pSVar13,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
        bVar29 = bVar30;
        if ((bVar27 == 0x2d) || (((uint)unaff_R12 & 0xff) == 0x2b)) break;
        std::__cxx11::string::_M_replace_aux((ulong)&local_1f8,local_1f8._M_string_length,0,'\x01');
        uVar22 = (long)(this->reader_).ptr_ + 1;
        (this->reader_).ptr_ = (int)uVar22;
        if ((this->reader_).len_ <= (int)uVar22) goto LAB_0010d194;
        bVar27 = (this->reader_).sbuffer_[uVar22];
        unaff_R12 = (ulong)bVar27;
        if ((9 < (byte)(bVar27 - 0x30)) &&
           ((0x3a < bVar27 - 0x2b ||
            ((0x400000004000005U >> ((ulong)(bVar27 - 0x2b) & 0x3f) & 1) == 0)))) goto LAB_0010d17e;
      }
      uVar22 = (ulong)(this->reader_).ptr_;
      if ((0 < (long)uVar22) && (bVar28 = 1, ((this->reader_).sbuffer_[uVar22 - 1] & 0xdfU) == 0x45)
         ) goto LAB_0010cb4d;
LAB_0010d17e:
      iVar4 = (int)uVar22;
      if (bVar27 == 0x2e) {
        bVar28 = 0;
        goto LAB_0010cb4d;
      }
      if (bVar27 == 0xff) {
LAB_0010d194:
        iVar4 = (int)uVar22;
        if ((bVar29) &&
           ((iVar4 < 1 || (9 < (byte)((this->reader_).sbuffer_[(uVar22 & 0xffffffff) - 1] - 0x30U)))
           )) {
          pSVar13 = (SyntaxError *)__cxa_allocate_exception(0x28);
          local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"after digit e/E errro","");
          SyntaxError::SyntaxError(pSVar13,(string *)local_1d0);
          __cxa_throw(pSVar13,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
        }
      }
      (this->reader_).ptr_ = iVar4 - 1U;
      cVar16 = -1;
      if ((0 < iVar4) && (iVar4 <= (this->reader_).len_)) {
        cVar16 = (this->reader_).sbuffer_[iVar4 - 1U];
      }
      this->lookforward_ = cVar16;
      __p_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)operator_new(0x50);
      local_1d8 = (pointer)toAny<double>(&local_1f8);
      Token::Token((Token *)__p_00,Number);
      __p_00->_M_allocated_capacity = (size_type)&PTR__Token_00118a20;
      (((string *)(__p_00->_M_local_buf + 0x48))->_M_dataplus)._M_p =
           (pointer)(long)(double)local_1d8;
      local_1d0._0_8_ = __p_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Number*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &((key_type *)local_1d0)->_M_string_length,(Number *)__p_00);
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
      local_48.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_;
    }
    if (local_48.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<calculator::Token,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == paVar6) {
      return;
    }
    lVar21 = CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                      local_1f8.field_2._M_local_buf[0]);
    _Var23._M_p = local_1f8._M_dataplus._M_p;
LAB_0010d65e:
    operator_delete(_Var23._M_p,lVar21 + 1);
    return;
  case 0x2f:
    pTVar7 = (Token *)operator_new(0x48);
    Token::Token(pTVar7,Div);
    local_1d0._0_8_ = pTVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Token*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((key_type *)local_1d0)->_M_string_length,pTVar7);
    std::
    vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>::
    emplace_back<std::shared_ptr<calculator::Token>>
              ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                *)&this->tokenlist_,(shared_ptr<calculator::Token> *)local_1d0);
    break;
  case 0x30:
    lVar19 = (long)(int)uVar24;
    lVar21 = lVar19 + 1;
    iVar26 = (int)lVar21;
    if (iVar4 <= iVar26) {
      (this->reader_).ptr_ = iVar26;
LAB_0010cfb6:
      local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
      local_1c0[0]._M_local_buf[0] = '\0';
      local_1d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)operator_new(0x50);
      Token::Token((Token *)paVar6,Number);
      paVar6->_M_allocated_capacity = (size_type)&PTR__Token_00118a20;
      (((string *)(paVar6->_M_local_buf + 0x48))->_M_dataplus)._M_p = (pointer)0x0;
      local_1f8._M_dataplus._M_p = (pointer)paVar6;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Number*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                 (Number *)paVar6);
LAB_0010cff0:
      this_00 = local_1f8._M_string_length;
      piVar1 = &(this->reader_).ptr_;
      *piVar1 = *piVar1 + -1;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_1f8._M_string_length + 8) =
               *(_Atomic_word *)(local_1f8._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_1f8._M_string_length + 8) =
               *(_Atomic_word *)(local_1f8._M_string_length + 8) + 1;
        }
      }
      std::
      vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
      ::emplace_back<std::shared_ptr<calculator::Token>>
                ((vector<std::shared_ptr<calculator::Token>,std::allocator<std::shared_ptr<calculator::Token>>>
                  *)&this->tokenlist_,(shared_ptr<calculator::Token> *)&local_1f8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._0_8_ == &((key_type *)local_1d0)->field_2) {
        return;
      }
      goto LAB_0010d659;
    }
    pcVar17 = (this->reader_).sbuffer_;
    if (pcVar17[lVar21] != '.') {
      if ((byte)(pcVar17[lVar21] - 0x30U) < 10) {
        this_01 = (ZeroNumberException *)__cxa_allocate_exception(0x28);
        lVar21 = (long)(this->reader_).ptr_ + 1;
        iVar4 = -0x31;
        if ((int)lVar21 < (this->reader_).len_) {
          iVar4 = (this->reader_).sbuffer_[lVar21] + -0x30;
        }
        ZeroNumberException::ZeroNumberException(this_01,iVar4);
        __cxa_throw(this_01,&ZeroNumberException::typeinfo,SyntaxError::~SyntaxError);
      }
      (this->reader_).ptr_ = iVar26;
      cVar16 = pcVar17[lVar21];
      local_1d0._0_8_ = &((key_type *)local_1d0)->field_2;
      local_1d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1c0[0]._M_local_buf[0] = '\0';
      if (cVar16 == 'b') {
        iVar26 = (int)(lVar19 + 2);
        (this->reader_).ptr_ = iVar26;
        if (iVar26 < iVar4) {
          bVar28 = pcVar17[lVar19 + 2];
          if ((bVar28 & 0xfe) == 0x30) {
            do {
              std::__cxx11::string::_M_replace_aux((ulong)local_1d0,local_1d0._8_8_,0,'\x01');
              lVar21 = (long)(this->reader_).ptr_ + 1;
              iVar4 = (int)lVar21;
              (this->reader_).ptr_ = iVar4;
              if ((this->reader_).len_ <= iVar4) goto LAB_0010d7c6;
              bVar28 = (this->reader_).sbuffer_[lVar21];
            } while ((bVar28 & 0xfe) == 0x30);
          }
          if (((byte)(bVar28 - 0x32) < 8) || ((byte)((bVar28 & 0xdf) + 0xbf) < 0x1a)) {
            pHVar15 = (HexBinOctException *)__cxa_allocate_exception(0x28);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x01');
            HexBinOctException::HexBinOctException(pHVar15,&local_1f8);
            __cxa_throw(pHVar15,&HexBinOctException::typeinfo,SyntaxError::~SyntaxError);
          }
        }
LAB_0010d7c6:
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)operator_new(0x50);
        pcVar14 = (pointer)toBase<long,2ul>((string *)local_1d0);
        Token::Token((Token *)paVar6,Number);
        paVar6->_M_allocated_capacity = (size_type)&PTR__Token_00118a20;
        (((string *)(paVar6->_M_local_buf + 0x48))->_M_dataplus)._M_p = pcVar14;
        local_1f8._M_dataplus._M_p = (pointer)paVar6;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Number*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                   (Number *)paVar6);
      }
      else {
        if (cVar16 != 'o') {
          if (cVar16 == 'x') {
            iVar26 = uVar24 + 2;
            (this->reader_).ptr_ = iVar26;
            bVar28 = 0xff;
            if (iVar4 <= iVar26) goto LAB_0010dfc9;
            do {
              bVar28 = pcVar17[iVar26];
LAB_0010dfc9:
              do {
                if ((9 < (byte)(bVar28 - 0x30)) &&
                   ((0x25 < bVar28 - 0x41 ||
                    ((0x3f0000003fU >> ((ulong)(bVar28 - 0x41) & 0x3f) & 1) == 0)))) {
                  if (('F' < (char)bVar28) && ((byte)((bVar28 & 0xdf) + 0xbf) < 0x1a)) {
                    pHVar15 = (HexBinOctException *)__cxa_allocate_exception(0x28);
                    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                    std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x01');
                    HexBinOctException::HexBinOctException(pHVar15,&local_1f8);
                    __cxa_throw(pHVar15,&HexBinOctException::typeinfo,SyntaxError::~SyntaxError);
                  }
                  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)operator_new(0x50);
                  pcVar14 = (pointer)toBase<long,16ul>((string *)local_1d0);
                  Token::Token((Token *)paVar6,Number);
                  paVar6->_M_allocated_capacity = (size_type)&PTR__Token_00118a20;
                  (((string *)(paVar6->_M_local_buf + 0x48))->_M_dataplus)._M_p = pcVar14;
                  local_1f8._M_dataplus._M_p = (pointer)paVar6;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<calculator::Number*>
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &local_1f8._M_string_length,(Number *)paVar6);
                  goto LAB_0010cff0;
                }
                std::__cxx11::string::_M_replace_aux((ulong)local_1d0,local_1d0._8_8_,0,'\x01');
                iVar26 = (this->reader_).ptr_ + 1;
                (this->reader_).ptr_ = iVar26;
                bVar28 = 0xff;
              } while ((this->reader_).len_ <= iVar26);
              pcVar17 = (this->reader_).sbuffer_;
            } while( true );
          }
          goto LAB_0010cfb6;
        }
        iVar26 = (int)(lVar19 + 2);
        (this->reader_).ptr_ = iVar26;
        if (iVar26 < iVar4) {
          bVar28 = pcVar17[lVar19 + 2];
          if ((bVar28 & 0xf8) == 0x30) {
            do {
              std::__cxx11::string::_M_replace_aux((ulong)local_1d0,local_1d0._8_8_,0,'\x01');
              lVar21 = (long)(this->reader_).ptr_ + 1;
              iVar4 = (int)lVar21;
              (this->reader_).ptr_ = iVar4;
              if ((this->reader_).len_ <= iVar4) goto LAB_0010d6ff;
              bVar28 = (this->reader_).sbuffer_[lVar21];
            } while ((bVar28 & 0xf8) == 0x30);
          }
          if (((byte)(bVar28 - 0x30) < 10 && (bVar28 & 0xfe) == 0x38) ||
             ((byte)((bVar28 & 0xdf) + 0xbf) < 0x1a)) {
            pHVar15 = (HexBinOctException *)__cxa_allocate_exception(0x28);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x01');
            HexBinOctException::HexBinOctException(pHVar15,&local_1f8);
            __cxa_throw(pHVar15,&HexBinOctException::typeinfo,SyntaxError::~SyntaxError);
          }
        }
LAB_0010d6ff:
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)operator_new(0x50);
        pcVar14 = (pointer)toBase<long,8ul>((string *)local_1d0);
        Token::Token((Token *)paVar6,Number);
        paVar6->_M_allocated_capacity = (size_type)&PTR__Token_00118a20;
        (((string *)(paVar6->_M_local_buf + 0x48))->_M_dataplus)._M_p = pcVar14;
        local_1f8._M_dataplus._M_p = (pointer)paVar6;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<calculator::Number*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1f8._M_string_length,
                   (Number *)paVar6);
      }
      goto LAB_0010cff0;
    }
    bVar30 = false;
    goto LAB_0010cb18;
  }
LAB_0010cf77:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
  }
  return;
}

Assistant:

void Lexer::scan() {
    char c;
    // 标志是否为负数
    bool minus = false;
    // 跳过空白字符
    while (!reader_.eof()) {
        c = reader_.get();
        if (c == EOF) return;
        if (isspace(c))
            continue;
        else if (isnewline_(c))
            line_++;
        else if (c == '+' || c == '-') {
            char nc;
            // 判断是否出现多个连续的 +-符号
            while (isspace((nc = reader_.get())))
                ;
            if (c == nc) {
                throw SyntaxError("can not present continue symbol ++/--");
            } else {
                reader_.back();
                break;
            }
        } else
            break;
    }

    // )+   )- 向前看字符如果是 ) 说明当前的 +/- 一定是一个 减法或加法
    if (lookforward_ != ')' && !isexponent(lookforward_) &&
        (c == '-' || c == '+')) {
        // +100 / -100  0.+100
        // 对于表达式 1 + -100 和 1. - 100 可以识别出来
        if (!isdigit(lookforward_) && !isletter(lookforward_) &&
            lookforward_ != '.') {
            if (c == '-') minus = true;
            c = reader_.get();
            while (isspace(c)) c = reader_.get();
        }
    }
    // 保存前一个字符
    lookforward_ = c;

    switch (c) {
        case '&':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::And)));
        case '|':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Or)));
        case '!':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Not)));
        case '^':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Xor)));
        case '~':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Negate)));
        case '+':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Add)));
        case '-': {
            // -表示一个负数，而非减法
            if (minus) break;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Sub)));
        }
        case '*': {
            if (auto [ok, c] = reader_.geteq('*'); ok) {
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::Pow)));
            } else {
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::Mul)));
            }
        }
        case '/':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Div)));
        case '=':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Equal)));
        case '%':
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::Mod)));
        case '<': {
            // <<左移
            if (auto [ok, c] = reader_.geteq('<'); ok)
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::ShiftLeft)));
            else
                throw SyntaxError("unexpected <?");
        } break;
        case '>': {
            // >>右移
            if (auto [ok, c] = reader_.geteq('>'); ok)
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Token(Tag::ShiftRight)));
            else
                throw SyntaxError("unexpected >?");
        }
        default:
            break;
    }
    /*
     * 处理进制数
     * 十六进制: 0xabcdef
     * 八进制:  0o1234567
     * 二进制:  0b1010101
     */
    if (c == '0') {
        // 处理小数
        if (reader_.peek() == '.') goto __integer_float_number_state;
        // 整数第一个数不能为0
        if (isdigit(reader_.peek()))
            throw ZeroNumberException(reader_.peek() - '0');

        c = reader_.get();
        std::string str;
        // 将非十进制的数字转化为十进制整数
        std::shared_ptr<Number> num = nullptr;

        // 判断下一个字符是否表示进制
        switch (c) {
            case 'x': {
                c = reader_.get();
                while (ishex(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if (isletter(c) && (c > 'f' || c > 'F'))
                    throw HexBinOctException(std::string(1, c));

                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 16>(str)));
            } break;
            case 'o': {
                c = reader_.get();
                while (isoct(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if ((isdigit(c) && (c > '7' && c <= '9')) || isletter(c))
                    throw HexBinOctException(std::string(1, c));
                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 8>(str)));
            } break;
            case 'b':
                c = reader_.get();
                while (isbin(c)) {
                    str.append(1, c);
                    c = reader_.get();
                }
                if ((isdigit(c) && (c > '1' && c <= '9')) || isletter(c))
                    throw HexBinOctException(std::string(1, c));
                num = std::shared_ptr<Number>(
                    new Number(toBase<Integer, 2>(str)));
                break;
            default:
                // 单独的整数0
                num = std::shared_ptr<Number>(new Number(0));
        }
        // 回退一个字符
        reader_.back();
        return tokenlist_.push_back(num);
    }

__integer_float_number_state:
    // 整数或浮点数
    if (isdigit(c) || c == '.') {
        std::string s;
        bool once_add_sub = false, once_exponent = false;
        if (minus) s += '-';
        if (c == '.') goto __float_state;
        do {
            if (isexponent(c)) {
                if (once_exponent) throw SyntaxError("expoent e/E is to many!");
                once_exponent = true;
            }
            // e/E+/-/数字
            if (c == '-' || c == '+') {
                // 只能出现一次e/E+/-
                if (isexponent(reader_.backc())) {
                    once_add_sub = true;
                    goto __float_state;
                } else
                    break;
            }
            s.append(1, c);
            c = reader_.get();
        } while (isdigit(c) || isexponent(c) || c == '-' || c == '+');
        if (c != '.') {
            // 读取到最后一个字符，但是数字后面存在一个E
            if (c == EOF) {
                if (once_exponent && !isdigit(reader_.backc()))
                    throw SyntaxError("after digit e/E errro");
            }
            reader_.back();
            lookforward_ = reader_.cur();
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Number(toAny<double>(s))));
        }
    __float_state:
        // 添加小数点
        s.append(1, c);
        for (;;) {
            c = reader_.get();
            if (isexponent(c)) {
                if (once_exponent) throw SyntaxError("expoent e/E is to many!");
                once_exponent = true;
            }
            if (c == '+' || c == '-') {
                // 再次出现 +/- 时就表示加减法
                if (once_add_sub) break;
                once_add_sub = true;
                // 只能在e/E后面出现一次+/-
                if (!isexponent(reader_.backc())) break;
            }
            if (!isdigit(c) && !isexponent(c) && c != '+' && c != '-') break;
            s.append(1, c);
        }
        reader_.back();
        lookforward_ = reader_.cur();
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Float(toAny<double>(s))));
    }
    // 变量名/函数名 可以是字母和数字的组合
    if (isletter(c)) {
        std::string b;
        // 字母
        do {
            b.append(1, c);
            c = reader_.get();
        } while (isletter(c));
        // 数字
        while (isdigit(c)) {
            b.append(1, c);
            c = reader_.get();
        }
        // 如果变量名表示的是一个函数名(查表)
        if (c == '(') {
            if (isUnaryFunction(b)) {
                reader_.back();
                is_function_ = true;
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new Function(b, minus)));
            } else if (isBinaryFunction(b)) {
                reader_.back();
                is_function_ = true;
                return tokenlist_.push_back(
                    std::shared_ptr<Token>(new BinaryFunction(b, minus)));
            } else
                throw FunctionNotDefined(b);
        } else {
            // 回退一个位置，因为还需要将 (
            // 作为token保存下来(目的是后续判断当前变量名是否是一个函数名)
            reader_.back();
            // 变量名不存在，则保存到变量表中。注意，函数名不需要保存到表中！！！
            if (auto it = variable.find(b); it == variable.end()) {
                auto word = std::shared_ptr<Token>(new Word(b, minus));
                variable[b] = word;
                return tokenlist_.push_back(word);
            } else {
                // 变量/常量附带一个负号标志
                // 比如 a=100;b=-a / -pi
                // 这里处理方法是将 -a 看作 -1 * a
                if (minus) {
                    tokenlist_.push_back(
                        std::shared_ptr<Token>(new Number(-1)));
                    tokenlist_.push_back(
                        std::shared_ptr<Token>(new Token(Tag::Mul)));
                }
                // 如果变量存在常量表中，那么就直接将这个变量替换为对应的常量值
                if (auto x = constant.find(it->first); x != constant.end()) {
                    return tokenlist_.push_back(
                        std::shared_ptr<Token>(new Float(x->second)));
                }
                // 否则直接返回表中变量名
                return tokenlist_.push_back(it->second);
            }
        }
        // 变量声明的分隔符;
    } else if (c == ';') {
        // ; ; 过滤多个连续的分隔符
        if (!tokenlist_.empty() && tokenlist_.back()->type() == Tag::END_SEP)
            return;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::END_SEP)));

    } else if (c == '(') {
        // 函数的开始标志符 (
        if (is_function_) {
            bracket_match_.push(true);
            is_function_ = false;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::BEGIN_FUNC)));
        }
        // 普通的左括号
        bracket_match_.push(false);
        is_function_ = false;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::BEGIN_BRACKET)));

    } else if (c == ')') {
        // 如果栈为空，说明括号不匹配
        if (bracket_match_.empty())
            throw SyntaxError("expression unexpected (!");

        // 函数的结尾标识符 )
        bool isEndOfFunction = bracket_match_.top();
        bracket_match_.pop();
        if (isEndOfFunction) {
            is_function_ = false;
            return tokenlist_.push_back(
                std::shared_ptr<Token>(new Token(Tag::END_FUNC)));
        }
        // 普通的右括号
        is_function_ = false;
        return tokenlist_.push_back(
            std::shared_ptr<Token>(new Token(Tag::END_BRACKET)));
    }
    // 根据其字符来指定其token，比如二元函数的分隔符号,
    return tokenlist_.push_back(std::shared_ptr<Token>(new Token(c)));
}